

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextGLImpl.cpp
# Opt level: O0

void __thiscall
Diligent::DeviceContextGLImpl::PrepareForDraw
          (DeviceContextGLImpl *this,DRAW_FLAGS Flags,bool IsIndexed,GLenum *GlTopology)

{
  PRIMITIVE_TOPOLOGY PrimTopology;
  GLFrameBufferObj *this_00;
  bool bVar1;
  DRAW_FLAGS DVar2;
  byte bVar3;
  Uint32 DrawBuffersMask;
  GLenum GVar4;
  FBOCache *this_01;
  Char *pCVar5;
  PipelineStateGLImpl *pPVar6;
  GraphicsPipelineDesc *pGVar7;
  RenderDeviceGLImpl *pRVar8;
  NativeGLContextType p_Var9;
  BufferGLImpl *pBVar10;
  GLVertexArrayObj *pGVar11;
  char (*in_stack_fffffffffffffef8) [2];
  Int32 NumVertices;
  PRIMITIVE_TOPOLOGY Topology;
  GLVertexArrayObj *VAO_1;
  GLVertexArrayObj *VAO;
  VAOAttribs vaoAttribs;
  VAOCache *VaoCache;
  GraphicsPipelineDesc *PipelineDesc;
  undefined1 local_80 [4];
  Uint32 BindSRBMask;
  string msg_1;
  GLFrameBufferObj *FBO;
  FBOCache *FboCache;
  undefined1 local_40 [8];
  string msg;
  GLenum *GlTopology_local;
  bool IsIndexed_local;
  DRAW_FLAGS Flags_local;
  DeviceContextGLImpl *this_local;
  
  msg.field_2._8_8_ = GlTopology;
  bVar1 = GLContextState::IsValidFBOBound(&this->m_ContextState);
  if (((!bVar1) &&
      ((this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).m_NumBoundRenderTargets == 0))
     && (bVar1 = RefCntAutoPtr<Diligent::TextureViewGLImpl>::operator!
                           (&(this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).
                             m_pBoundDepthStencil), bVar1)) {
    if (((this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).m_FramebufferWidth == 0) ||
       ((this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).m_FramebufferHeight == 0)) {
      FormatString<char[131]>
                ((string *)local_40,
                 (char (*) [131])
                 "Framebuffer width and height must be positive when rendering without attachments. Call SetViewports() to set the framebuffer size."
                );
      pCVar5 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar5,"PrepareForDraw",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
                 ,0x2f5);
      std::__cxx11::string::~string((string *)local_40);
    }
    pRVar8 = RefCntAutoPtr<Diligent::RenderDeviceGLImpl>::operator->
                       (&(this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).m_pDevice);
    p_Var9 = GLContextState::GetCurrentGLContext(&this->m_ContextState);
    this_01 = RenderDeviceGLImpl::GetFBOCache(pRVar8,p_Var9);
    msg_1.field_2._8_8_ =
         FBOCache::GetFBO(this_01,(this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).
                                  m_FramebufferWidth,
                          (this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).
                          m_FramebufferHeight,&this->m_ContextState);
    GLContextState::BindFBO(&this->m_ContextState,(GLFrameBufferObj *)msg_1.field_2._8_8_);
    this->m_DrawFBO = (GLFrameBufferObj *)0x0;
  }
  if ((this->m_DrawBuffersCommitted & 1U) == 0) {
    if ((((this->m_IsDefaultFBOBound & 1U) == 0) &&
        ((this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).m_NumBoundRenderTargets != 0)
        ) && ((this->m_DrawFBO != (GLFrameBufferObj *)0x0 &&
              (bVar1 = Diligent::RefCntAutoPtr::operator_cast_to_bool
                                 ((RefCntAutoPtr *)
                                  &(this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).
                                   m_pPipelineState), bVar1)))) {
      pPVar6 = RefCntAutoPtr<Diligent::PipelineStateGLImpl>::operator->
                         (&(this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).
                           m_pPipelineState);
      pGVar7 = PipelineStateBase<Diligent::EngineGLImplTraits>::GetGraphicsPipelineDesc
                         (&pPVar6->super_PipelineStateBase<Diligent::EngineGLImplTraits>);
      if ((uint)pGVar7->NumRenderTargets !=
          (this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).m_NumBoundRenderTargets) {
        pPVar6 = RefCntAutoPtr<Diligent::PipelineStateGLImpl>::operator->
                           (&(this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).
                             m_pPipelineState);
        pGVar7 = PipelineStateBase<Diligent::EngineGLImplTraits>::GetGraphicsPipelineDesc
                           (&pPVar6->super_PipelineStateBase<Diligent::EngineGLImplTraits>);
        FormatString<char[53],unsigned_char,char[54],unsigned_int,char[2]>
                  ((string *)local_80,
                   (Diligent *)"The number of render targets in the pipeline state (",
                   (char (*) [53])&pGVar7->NumRenderTargets,
                   (uchar *)") does not match the number of bound render targets (",
                   (char (*) [54])
                   &(this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).
                    m_NumBoundRenderTargets,(uint *)0xf65f2d,in_stack_fffffffffffffef8);
        pCVar5 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar5,"PrepareForDraw",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
                   ,0x305);
        std::__cxx11::string::~string((string *)local_80);
      }
      this_00 = this->m_DrawFBO;
      pPVar6 = RefCntAutoPtr<Diligent::PipelineStateGLImpl>::operator->
                         (&(this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).
                           m_pPipelineState);
      DrawBuffersMask =
           PipelineStateBase<Diligent::EngineGLImplTraits>::GetRenderTargetMask
                     (&pPVar6->super_PipelineStateBase<Diligent::EngineGLImplTraits>);
      GLObjectWrappers::GLFrameBufferObj::SetDrawBuffers(this_00,0xffffffff,DrawBuffersMask);
    }
    this->m_DrawBuffersCommitted = true;
  }
  DeviceContextBase<Diligent::EngineGLImplTraits>::DvpVerifyRenderTargets
            (&this->super_DeviceContextBase<Diligent::EngineGLImplTraits>);
  pPVar6 = RefCntAutoPtr<Diligent::PipelineStateGLImpl>::operator->
                     (&(this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).
                       m_pPipelineState);
  PipelineStateGLImpl::CommitProgram(pPVar6,&this->m_ContextState);
  DVar2 = Diligent::operator&(Flags,DRAW_FLAG_DYNAMIC_RESOURCE_BUFFERS_INTACT);
  bVar3 = DeviceContextBase<Diligent::EngineGLImplTraits>::CommittedShaderResources::GetCommitMask
                    (&(this->m_BindInfo).super_CommittedShaderResources,DVar2 != DRAW_FLAG_NONE);
  if (bVar3 != 0) {
    BindProgramResources(this,(uint)bVar3);
  }
  DvpValidateCommittedShaderResources(this);
  pPVar6 = RefCntAutoPtr<Diligent::PipelineStateGLImpl>::operator->
                     (&(this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).
                       m_pPipelineState);
  pGVar7 = PipelineStateBase<Diligent::EngineGLImplTraits>::GetGraphicsPipelineDesc
                     (&pPVar6->super_PipelineStateBase<Diligent::EngineGLImplTraits>);
  bVar1 = GLContextState::IsValidVAOBound(&this->m_ContextState);
  if (!bVar1) {
    pRVar8 = RefCntAutoPtr<Diligent::RenderDeviceGLImpl>::operator->
                       (&(this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).m_pDevice);
    p_Var9 = GLContextState::GetCurrentGLContext(&this->m_ContextState);
    vaoAttribs._24_8_ = RenderDeviceGLImpl::GetVAOCache(pRVar8,p_Var9);
    if (((pGVar7->InputLayout).NumElements == 0) &&
       (pBVar10 = Diligent::RefCntAutoPtr::operator_cast_to_BufferGLImpl_
                            ((RefCntAutoPtr *)
                             &(this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).
                              m_pIndexBuffer), pBVar10 == (BufferGLImpl *)0x0)) {
      pGVar11 = VAOCache::GetEmptyVAO((VAOCache *)vaoAttribs._24_8_);
      GLContextState::BindVAO(&this->m_ContextState,pGVar11);
    }
    else {
      VAO = (GLVertexArrayObj *)
            RefCntAutoPtr<Diligent::PipelineStateGLImpl>::operator*
                      (&(this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).
                        m_pPipelineState);
      vaoAttribs.PSO =
           (PipelineStateGLImpl *)
           Diligent::RefCntAutoPtr::operator_cast_to_BufferGLImpl_
                     ((RefCntAutoPtr *)
                      &(this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).m_pIndexBuffer)
      ;
      vaoAttribs.pIndexBuffer =
           (BufferGLImpl *)
           (this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).m_VertexStreams;
      vaoAttribs.VertexStreams._0_4_ =
           (this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).m_NumVertexStreams;
      pGVar11 = VAOCache::GetVAO((VAOCache *)vaoAttribs._24_8_,(VAOAttribs *)&VAO,
                                 &this->m_ContextState);
      GLContextState::BindVAO(&this->m_ContextState,pGVar11);
    }
  }
  PrimTopology = pGVar7->PrimitiveTopology;
  if (PrimTopology < PRIMITIVE_TOPOLOGY_1_CONTROL_POINT_PATCHLIST) {
    GVar4 = PrimitiveTopologyToGLTopology(PrimTopology);
    *(GLenum *)msg.field_2._8_8_ = GVar4;
  }
  else {
    *(undefined4 *)msg.field_2._8_8_ = 0xe;
    GLContextState::SetNumPatchVertices(&this->m_ContextState,PrimTopology - 9);
  }
  return;
}

Assistant:

void DeviceContextGLImpl::PrepareForDraw(DRAW_FLAGS Flags, bool IsIndexed, GLenum& GlTopology)
{
    if (!m_ContextState.IsValidFBOBound() && m_NumBoundRenderTargets == 0 && !m_pBoundDepthStencil)
    {
        // Framebuffer without attachments
        DEV_CHECK_ERR(m_FramebufferWidth > 0 && m_FramebufferHeight > 0,
                      "Framebuffer width and height must be positive when rendering without attachments. Call SetViewports() to set the framebuffer size.");
        FBOCache& FboCache = m_pDevice->GetFBOCache(m_ContextState.GetCurrentGLContext());

        const GLObjectWrappers::GLFrameBufferObj& FBO = FboCache.GetFBO(m_FramebufferWidth, m_FramebufferHeight, m_ContextState);
        m_ContextState.BindFBO(FBO);
        m_DrawFBO = nullptr;
    }

    if (!m_DrawBuffersCommitted)
    {
        if (!m_IsDefaultFBOBound && m_NumBoundRenderTargets > 0 && m_DrawFBO != nullptr)
        {
            if (m_pPipelineState)
            {
                VERIFY(m_pPipelineState->GetGraphicsPipelineDesc().NumRenderTargets == m_NumBoundRenderTargets,
                       "The number of render targets in the pipeline state (", m_pPipelineState->GetGraphicsPipelineDesc().NumRenderTargets,
                       ") does not match the number of bound render targets (", m_NumBoundRenderTargets, ")");
                m_DrawFBO->SetDrawBuffers(~0u, m_pPipelineState->GetRenderTargetMask());
            }
        }
        m_DrawBuffersCommitted = true;
    }

#ifdef DILIGENT_DEVELOPMENT
    DvpVerifyRenderTargets();
#endif

    // The program might have changed since the last SetPipelineState call if a shader was
    // created after the call (ShaderResourcesGL needs to bind a program to load uniforms).
    m_pPipelineState->CommitProgram(m_ContextState);
    if (Uint32 BindSRBMask = m_BindInfo.GetCommitMask(Flags & DRAW_FLAG_DYNAMIC_RESOURCE_BUFFERS_INTACT))
    {
        BindProgramResources(BindSRBMask);
    }

#ifdef DILIGENT_DEVELOPMENT
    // Must be called after BindProgramResources as it needs BaseBindings
    DvpValidateCommittedShaderResources();
#endif

    const GraphicsPipelineDesc& PipelineDesc = m_pPipelineState->GetGraphicsPipelineDesc();
    if (!m_ContextState.IsValidVAOBound())
    {
        VAOCache& VaoCache = m_pDevice->GetVAOCache(m_ContextState.GetCurrentGLContext());
        if (PipelineDesc.InputLayout.NumElements > 0 || m_pIndexBuffer != nullptr)
        {
            VAOCache::VAOAttribs vaoAttribs //
                {
                    *m_pPipelineState,
                    m_pIndexBuffer,
                    m_VertexStreams,
                    m_NumVertexStreams //
                };
            const GLObjectWrappers::GLVertexArrayObj& VAO = VaoCache.GetVAO(vaoAttribs, m_ContextState);
            m_ContextState.BindVAO(VAO);
        }
        else
        {
            // Draw command will fail if no VAO is bound. If no vertex description is set
            // (which is the case if, for instance, the command only inputs VertexID),
            // use empty VAO
            const GLObjectWrappers::GLVertexArrayObj& VAO = VaoCache.GetEmptyVAO();
            m_ContextState.BindVAO(VAO);
        }
    }

    PRIMITIVE_TOPOLOGY Topology = PipelineDesc.PrimitiveTopology;
    if (Topology >= PRIMITIVE_TOPOLOGY_1_CONTROL_POINT_PATCHLIST)
    {
#if GL_ARB_tessellation_shader
        GlTopology        = GL_PATCHES;
        Int32 NumVertices = static_cast<Int32>(Topology - PRIMITIVE_TOPOLOGY_1_CONTROL_POINT_PATCHLIST + 1);
        m_ContextState.SetNumPatchVertices(NumVertices);
#else
        UNSUPPORTED("Tessellation is not supported");
#endif
    }
    else
    {
        GlTopology = PrimitiveTopologyToGLTopology(Topology);
    }
}